

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpTools.cpp
# Opt level: O2

void __thiscall UdpTools::~UdpTools(UdpTools *this)

{
  this->_vptr_UdpTools = (_func_int **)&PTR__UdpTools_00105d90;
  std::__cxx11::string::~string((string *)&this->specifiedInterface);
  return;
}

Assistant:

UdpTools::~UdpTools() {
	// TODO  Auto-generated destructor stub
}